

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_test.cpp
# Opt level: O0

void __thiscall
SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock>::~SpinMutexTest_TryLockFail_Test
          (SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock> *this)

{
  SpinMutexTest_TryLockFail_Test<yamc::posix::spinlock> *this_local;
  
  ~SpinMutexTest_TryLockFail_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(SpinMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    EXPECT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    EXPECT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}